

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UBool __thiscall
icu_63::UnicodeString::cloneArrayIfNeeded
          (UnicodeString *this,int32_t newCapacity,int32_t growCapacity,UBool doCopyArray,
          int32_t **pBufferToDelete,UBool forceClone)

{
  ushort uVar1;
  UBool UVar2;
  int32_t iVar3;
  char16_t *dst;
  u_atomic_int32_t *var;
  u_atomic_int32_t *pRefCount;
  int32_t minLength;
  int16_t flags;
  UChar **ppUStack_70;
  int32_t oldLength;
  UChar *oldArray;
  UChar oldStackBuffer [27];
  UBool forceClone_local;
  int32_t **pBufferToDelete_local;
  int local_20;
  int32_t iStack_1c;
  UBool doCopyArray_local;
  int32_t growCapacity_local;
  int32_t newCapacity_local;
  UnicodeString *this_local;
  
  oldStackBuffer[0x17]._1_1_ = forceClone;
  unique0x10000234 = pBufferToDelete;
  iStack_1c = newCapacity;
  if (newCapacity == -1) {
    iStack_1c = getCapacity(this);
  }
  UVar2 = isWritable(this);
  if (UVar2 == '\0') {
    this_local._7_1_ = '\0';
  }
  else {
    if ((((oldStackBuffer[0x17]._1_1_ != '\0') ||
         (((this->fUnion).fStackFields.fLengthAndFlags & 8U) != 0)) ||
        ((((this->fUnion).fStackFields.fLengthAndFlags & 4U) != 0 &&
         (iVar3 = refCount(this), 1 < iVar3)))) || (iVar3 = getCapacity(this), iVar3 < iStack_1c)) {
      if (growCapacity < 0) {
        local_20 = iStack_1c;
      }
      else {
        local_20 = growCapacity;
        if ((iStack_1c < 0x1c) && (0x1b < growCapacity)) {
          local_20 = 0x1b;
        }
      }
      pRefCount._4_4_ = length(this);
      uVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
      if ((uVar1 & 2) == 0) {
        ppUStack_70 = (UChar **)(this->fUnion).fFields.fArray;
      }
      else if ((doCopyArray == '\0') || (local_20 < 0x1c)) {
        ppUStack_70 = (UChar **)0x0;
      }
      else {
        us_arrayCopy((this->fUnion).fStackFields.fBuffer,0,(UChar *)&oldArray,0,pRefCount._4_4_);
        ppUStack_70 = &oldArray;
      }
      UVar2 = allocate(this,local_20);
      if ((UVar2 == '\0') &&
         ((local_20 <= iStack_1c || (UVar2 = allocate(this,iStack_1c), UVar2 == '\0')))) {
        if ((uVar1 & 2) == 0) {
          (this->fUnion).fFields.fArray = (char16_t *)ppUStack_70;
        }
        (this->fUnion).fStackFields.fLengthAndFlags = uVar1;
        setToBogus(this);
        return '\0';
      }
      if (doCopyArray == '\0') {
        setZeroLength(this);
      }
      else {
        iVar3 = getCapacity(this);
        if (iVar3 < pRefCount._4_4_) {
          pRefCount._4_4_ = iVar3;
        }
        if (ppUStack_70 != (UChar **)0x0) {
          dst = getArrayStart(this);
          us_arrayCopy((UChar *)ppUStack_70,0,dst,0,pRefCount._4_4_);
        }
        setLength(this,pRefCount._4_4_);
      }
      if ((uVar1 & 4) != 0) {
        var = (u_atomic_int32_t *)((long)ppUStack_70 + -4);
        iVar3 = umtx_atomic_dec(var);
        if (iVar3 == 0) {
          if (stack0xffffffffffffffd0 == (int32_t **)0x0) {
            uprv_free_63(var);
          }
          else {
            *stack0xffffffffffffffd0 = (int32_t *)var;
          }
        }
      }
    }
    this_local._7_1_ = '\x01';
  }
  return this_local._7_1_;
}

Assistant:

UBool
UnicodeString::cloneArrayIfNeeded(int32_t newCapacity,
                                  int32_t growCapacity,
                                  UBool doCopyArray,
                                  int32_t **pBufferToDelete,
                                  UBool forceClone) {
  // default parameters need to be static, therefore
  // the defaults are -1 to have convenience defaults
  if(newCapacity == -1) {
    newCapacity = getCapacity();
  }

  // while a getBuffer(minCapacity) is "open",
  // prevent any modifications of the string by returning FALSE here
  // if the string is bogus, then only an assignment or similar can revive it
  if(!isWritable()) {
    return FALSE;
  }

  /*
   * We need to make a copy of the array if
   * the buffer is read-only, or
   * the buffer is refCounted (shared), and refCount>1, or
   * the buffer is too small.
   * Return FALSE if memory could not be allocated.
   */
  if(forceClone ||
     fUnion.fFields.fLengthAndFlags & kBufferIsReadonly ||
     (fUnion.fFields.fLengthAndFlags & kRefCounted && refCount() > 1) ||
     newCapacity > getCapacity()
  ) {
    // check growCapacity for default value and use of the stack buffer
    if(growCapacity < 0) {
      growCapacity = newCapacity;
    } else if(newCapacity <= US_STACKBUF_SIZE && growCapacity > US_STACKBUF_SIZE) {
      growCapacity = US_STACKBUF_SIZE;
    }

    // save old values
    UChar oldStackBuffer[US_STACKBUF_SIZE];
    UChar *oldArray;
    int32_t oldLength = length();
    int16_t flags = fUnion.fFields.fLengthAndFlags;

    if(flags&kUsingStackBuffer) {
      U_ASSERT(!(flags&kRefCounted)); /* kRefCounted and kUsingStackBuffer are mutally exclusive */
      if(doCopyArray && growCapacity > US_STACKBUF_SIZE) {
        // copy the stack buffer contents because it will be overwritten with
        // fUnion.fFields values
        us_arrayCopy(fUnion.fStackFields.fBuffer, 0, oldStackBuffer, 0, oldLength);
        oldArray = oldStackBuffer;
      } else {
        oldArray = NULL; // no need to copy from the stack buffer to itself
      }
    } else {
      oldArray = fUnion.fFields.fArray;
      U_ASSERT(oldArray!=NULL); /* when stack buffer is not used, oldArray must have a non-NULL reference */
    }

    // allocate a new array
    if(allocate(growCapacity) ||
       (newCapacity < growCapacity && allocate(newCapacity))
    ) {
      if(doCopyArray) {
        // copy the contents
        // do not copy more than what fits - it may be smaller than before
        int32_t minLength = oldLength;
        newCapacity = getCapacity();
        if(newCapacity < minLength) {
          minLength = newCapacity;
        }
        if(oldArray != NULL) {
          us_arrayCopy(oldArray, 0, getArrayStart(), 0, minLength);
        }
        setLength(minLength);
      } else {
        setZeroLength();
      }

      // release the old array
      if(flags & kRefCounted) {
        // the array is refCounted; decrement and release if 0
        u_atomic_int32_t *pRefCount = ((u_atomic_int32_t *)oldArray - 1);
        if(umtx_atomic_dec(pRefCount) == 0) {
          if(pBufferToDelete == 0) {
              // Note: cast to (void *) is needed with MSVC, where u_atomic_int32_t
              // is defined as volatile. (Volatile has useful non-standard behavior
              //   with this compiler.)
            uprv_free((void *)pRefCount);
          } else {
            // the caller requested to delete it himself
            *pBufferToDelete = (int32_t *)pRefCount;
          }
        }
      }
    } else {
      // not enough memory for growCapacity and not even for the smaller newCapacity
      // reset the old values for setToBogus() to release the array
      if(!(flags&kUsingStackBuffer)) {
        fUnion.fFields.fArray = oldArray;
      }
      fUnion.fFields.fLengthAndFlags = flags;
      setToBogus();
      return FALSE;
    }
  }
  return TRUE;
}